

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_cast_data.hpp
# Opt level: O3

unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> __thiscall
duckdb::UnionBoundCastData::Copy(UnionBoundCastData *this)

{
  long in_RSI;
  _func_int **local_50;
  BoundCastInfo local_48;
  
  BoundCastInfo::Copy(&local_48,(BoundCastInfo *)(in_RSI + 0x50));
  make_uniq<duckdb::UnionBoundCastData,unsigned_char_const&,std::__cxx11::string_const&,duckdb::LogicalType_const&,long_const&,duckdb::BoundCastInfo>
            ((duckdb *)&local_50,(uchar *)(in_RSI + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x10),
             (LogicalType *)(in_RSI + 0x30),(long *)(in_RSI + 0x48),&local_48);
  (this->super_BoundCastData)._vptr_BoundCastData = local_50;
  local_50 = (_func_int **)0x0;
  if (local_48.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_48.cast_data.
                          super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
                          .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl + 8))
              ();
  }
  return (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)this;
}

Assistant:

unique_ptr<BoundCastData> Copy() const override {
		return make_uniq<UnionBoundCastData>(tag, name, type, cost, member_cast_info.Copy());
	}